

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer,
              BackwardReferenceFromDecoder *backward_references,size_t back_refs_size,
              BlockSplitFromDecoder *literals_block_splits_decoder,
              BlockSplitFromDecoder *cmds_block_splits_decoder)

{
  ulong uVar1;
  undefined3 uVar2;
  int iVar3;
  size_t sVar4;
  Command_conflict *p;
  uint32_t *puVar5;
  undefined8 uVar6;
  ContextType literal_context_mode;
  uint32_t uVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  ulong uVar11;
  BrotliEncoderState *s;
  ulong uVar12;
  HasherCommon *pHVar13;
  ulong uVar14;
  ulong uVar15;
  ZopfliNode *array;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  Command_conflict *pCVar19;
  uint16_t *storage;
  char cVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  HasherCommon *pHVar24;
  HasherCommon *pHVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  size_t *psVar29;
  ulong uVar30;
  ulong uVar31;
  uint uVar32;
  size_t sVar33;
  long lVar34;
  undefined4 *n;
  long lVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  size_t available;
  size_t out_size;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  size_t __n;
  bool bVar43;
  uint8_t last_bytes_bits;
  size_t local_800;
  uint16_t last_bytes;
  HasherCommon *local_7f0;
  ulong *local_7e8;
  size_t local_7e0;
  ulong local_7d8;
  Command_conflict *local_7d0;
  ulong local_7c8;
  ulong local_7c0;
  ulong local_7b8;
  ulong local_7b0;
  ulong local_7a8;
  ulong local_7a0;
  size_t num_literals;
  MemoryManager memory_manager;
  ulong local_778;
  ulong local_770;
  uint local_760;
  int dist_cache [4];
  ulong local_730;
  uint8_t *local_728;
  size_t local_708;
  size_t last_insert_len;
  size_t available_out;
  uint local_6e0;
  uint local_6dc;
  ulong local_6d0;
  int local_6c4;
  undefined8 local_6c0;
  uint uStack_6b8;
  int iStack_6b4;
  uint local_6b0;
  int saved_dist_cache [4];
  size_t current_block_cmds;
  size_t current_block_literals;
  uint8_t *next_in;
  BlockSplit local_5b8;
  BlockSplit local_588;
  uint32_t *local_558;
  size_t sStack_550;
  uint32_t *local_548;
  size_t sStack_540;
  HistogramLiteral *local_538;
  size_t sStack_530;
  HistogramCommand *local_528;
  size_t sStack_520;
  HistogramDistance *local_518;
  size_t sStack_510;
  size_t available_in;
  uint32_t *puStack_500;
  BrotliEncoderParams *pBStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  uint local_4e0;
  uint32_t local_4dc;
  undefined1 local_4d8 [20];
  int iStack_4c4;
  undefined8 local_4c0;
  size_t local_4b8;
  uint local_4b0;
  undefined4 uStack_4ac;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  HROLLING local_490;
  undefined8 local_468;
  undefined4 uStack_460;
  undefined4 uStack_45c;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined4 local_428;
  undefined8 local_420;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  uint8_t *next_out;
  uint32_t local_74;
  
  uVar1 = *encoded_size;
  local_7f0 = (HasherCommon *)input_buffer;
  local_7e8 = encoded_size;
  sVar10 = BrotliEncoderMaxCompressedSize(input_size);
  if (uVar1 == 0) {
    return 0;
  }
  if (input_size == 0) {
    *local_7e8 = 1;
    *encoded_buffer = '\x06';
    return 1;
  }
  local_800 = input_size;
  if (quality != 10) {
    s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    s->backward_references_ = backward_references;
    s->back_refs_size_ = back_refs_size;
    s->literals_block_splits_decoder_ = literals_block_splits_decoder;
    s->cmds_block_splits_decoder_ = cmds_block_splits_decoder;
    available_in = local_800;
    next_in = (uint8_t *)local_7f0;
    available_out = *local_7e8;
    memory_manager.alloc_func = (brotli_alloc_func)0x0;
    next_out = encoded_buffer;
    if (s->is_initialized_ == 0) {
      (s->params).quality = quality;
      (s->params).lgwin = lgwin;
      (s->params).mode = mode;
      (s->params).size_hint = local_800 & 0xffffffff;
      if (0x18 < lgwin) {
        (s->params).large_window = 1;
      }
    }
    iVar8 = BrotliEncoderCompressStream
                      (s,BROTLI_OPERATION_FINISH,&available_in,&next_in,&available_out,&next_out,
                       (size_t *)&memory_manager);
    if ((s->stream_state_ != BROTLI_STREAM_FINISHED) || (s->available_out_ != 0)) {
      iVar8 = 0;
    }
    *local_7e8 = (ulong)memory_manager.alloc_func;
    BrotliEncoderDestroyInstance(s);
    if (iVar8 != 0) {
      if (sVar10 == 0) {
        return 1;
      }
      if (*local_7e8 <= sVar10) {
        return 1;
      }
    }
    goto LAB_00105684;
  }
  uVar9 = 0x10;
  uVar23 = uVar9;
  if (0x10 < lgwin) {
    uVar23 = lgwin;
  }
  uVar32 = 0x1e;
  if ((int)uVar23 < 0x1e) {
    uVar32 = uVar23;
  }
  current_block_literals = 0;
  current_block_cmds = 0;
  dist_cache[0] = 4;
  dist_cache[1] = 0xb;
  dist_cache[2] = 0xf;
  dist_cache[3] = 0x10;
  local_7e0 = 1L << ((byte)uVar32 & 0x3f);
  if (input_size < local_7e0) {
    local_7e0 = input_size;
  }
  cVar20 = '\x17';
  if ((int)uVar23 < 0x17) {
    cVar20 = (char)uVar23;
  }
  uVar11 = 1L << (cVar20 + 1U & 0x3f);
  saved_dist_cache[0] = 4;
  saved_dist_cache[1] = 0xb;
  saved_dist_cache[2] = 0xf;
  saved_dist_cache[3] = 0x10;
  available_in = 0;
  BrotliEncoderInitParams((BrotliEncoderParams *)&available_out);
  uVar23 = uVar32;
  local_6e0 = uVar32;
  if (lgwin < 0x19) {
    uVar22 = 0x1e;
    if (local_6c4 == 0) {
      uVar22 = 0x18;
    }
    if (uVar22 < uVar32) {
      uVar23 = 0x18;
      local_6e0 = uVar22;
    }
  }
  else {
    local_6c4 = 1;
  }
  available_out = CONCAT44(10,(undefined4)available_out);
  if (local_6dc == 0) {
    uVar22 = 0x10;
    if ((0x10 < uVar23) && (uVar22 = 0x12, uVar23 < 0x12)) {
      uVar22 = uVar23;
    }
  }
  else {
    if ((int)local_6dc < 0x11) {
      local_6dc = 0x10;
    }
    uVar22 = 0x18;
    if ((int)local_6dc < 0x18) {
      uVar22 = local_6dc;
    }
  }
  local_6dc = uVar22;
  ChooseDistanceParams((BrotliEncoderParams *)&available_out);
  uVar12 = 1L << ((byte)local_6dc & 0x3f);
  BrotliInitMemoryManager(&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
  pHVar25 = (HasherCommon *)&last_bytes_bits;
  EncodeWindowBits(uVar32,local_6c4,&last_bytes,(uint8_t *)pHVar25);
  sVar33 = local_7e0;
  if (available_in != 0) {
    pHVar24 = pHVar25;
    pHVar13 = local_7f0;
    if (local_4dc == 0) {
      iVar8 = (int)local_4f0;
      goto LAB_00104986;
    }
    goto LAB_00104b23;
  }
  uVar23 = 10;
  if ((int)available_out._4_4_ < 10) {
    uVar32 = available_out._4_4_;
    if (available_out._4_4_ == 4) {
      if (0xfffff < local_6d0) {
        local_6c0 = (uint32_t *)CONCAT44(local_6c0._4_4_,0x36);
        uVar23 = 0x36;
        goto LAB_0010452e;
      }
    }
    else if (4 < (int)available_out._4_4_) {
      if (0x10 < (int)local_6e0) {
        uStack_6b8 = available_out._4_4_ - 1;
        if ((local_6e0 < 0x13) || (local_6d0 < 0x100000)) {
          local_6b0 = uVar9;
          if (available_out._4_4_ < 9) {
            local_6b0 = uVar23;
          }
          local_6c0 = (uint32_t *)CONCAT44(0xf - (uint)(available_out._4_4_ < 7),5);
          if (available_out._4_4_ < 7) {
            local_6b0 = 4;
          }
          uVar23 = 5;
        }
        else {
          local_6c0 = (uint32_t *)0xf00000006;
          iStack_6b4 = 5;
          if (available_out._4_4_ < 9) {
            uVar9 = uVar23;
          }
          local_6b0 = uVar9;
          if (available_out._4_4_ < 7) {
            local_6b0 = 4;
          }
          uVar23 = 6;
        }
        goto LAB_0010452e;
      }
      uVar32 = 0x28;
      if (6 < available_out._4_4_) {
        uVar32 = 0x2a - (available_out._4_4_ < 9);
      }
    }
    uVar23 = uVar32;
    local_6c0 = (uint32_t *)CONCAT44(local_6c0._4_4_,uVar23);
  }
  else {
    local_6c0 = (uint32_t *)CONCAT44(local_6c0._4_4_,10);
  }
LAB_0010452e:
  pHVar25 = (HasherCommon *)0x0;
  pHVar13 = (HasherCommon *)0x0;
  bVar21 = local_6c0._4_1_;
  if ((int)local_6e0 < 0x19) {
    switch(uVar23 - 2) {
    case 0:
    case 1:
      goto switchD_0010455b_caseD_0;
    case 2:
      goto switchD_0010455b_caseD_2;
    case 3:
    case 4:
      goto switchD_0010455b_caseD_3;
    case 5:
    case 6:
    case 7:
      break;
    case 8:
      goto switchD_0010455b_caseD_8;
    default:
      switch(uVar23) {
      case 0x23:
        goto switchD_001045a6_caseD_23;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        break;
      case 0x28:
      case 0x29:
        goto switchD_0010455b_caseD_2;
      case 0x2a:
        goto switchD_001045a6_caseD_2a;
      default:
        if (uVar23 == 0x36) {
          n = (undefined4 *)0x400000;
          goto LAB_001046dc;
        }
      }
    }
    goto switchD_0010455b_caseD_5;
  }
  pHVar13 = pHVar25;
  switch(uVar23 - 2) {
  case 0:
switchD_0010455b_caseD_0:
    n = (undefined4 *)0x40000;
    break;
  case 1:
    local_6c0 = (uint32_t *)CONCAT44(local_6c0._4_4_,0x23);
switchD_001045a6_caseD_23:
    n = (undefined4 *)0x4040000;
    break;
  case 2:
switchD_0010455b_caseD_2:
    n = (undefined4 *)0x80000;
    break;
  case 3:
switchD_0010455b_caseD_3:
    n = (undefined4 *)
        (((4L << (bVar21 & 0x3f)) << ((byte)uStack_6b8 & 0x3f)) + (2L << (bVar21 & 0x3f)));
    goto LAB_001046d3;
  case 4:
    local_6c0 = (uint32_t *)CONCAT44(local_6c0._4_4_,0x41);
    n = (undefined4 *)
        (((4L << (bVar21 & 0x3f)) << ((byte)uStack_6b8 & 0x3f)) + (2L << (bVar21 & 0x3f)) +
        0x4000000);
LAB_001046d3:
    if (n != (undefined4 *)0x0) break;
    pHVar13 = (HasherCommon *)0x0;
  case 5:
  case 6:
  case 7:
    goto switchD_0010455b_caseD_5;
  case 8:
switchD_0010455b_caseD_8:
    uVar14 = 1L << ((byte)local_6e0 & 0x3f);
    if (local_7e0 <= uVar14) {
      uVar14 = local_7e0;
    }
    n = (undefined4 *)(uVar14 * 8 + 0x80000);
    break;
  default:
    switch(uVar23) {
    case 0x23:
      goto switchD_001045a6_caseD_23;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
    case 0x29:
      goto switchD_0010455b_caseD_2;
    case 0x2a:
switchD_001045a6_caseD_2a:
      n = &_IO_stdin_used;
      goto LAB_001046dc;
    default:
      if (uVar23 == 0x36) {
        local_6c0 = (uint32_t *)CONCAT44(local_6c0._4_4_,0x37);
        n = (undefined4 *)0x4400000;
        goto LAB_001046dc;
      }
    }
    goto switchD_0010455b_caseD_5;
  }
LAB_001046dc:
  pHVar13 = (HasherCommon *)BrotliAllocate(&memory_manager,(size_t)n);
switchD_0010455b_caseD_5:
  sVar4 = CONCAT44(iStack_6b4,uStack_6b8);
  local_4f0 = local_6c0;
  puVar5 = local_4f0;
  local_4e0 = local_6b0;
  local_4f0._0_4_ = (int)local_6c0;
  uVar6 = stack0xfffffffffffffb38;
  if ((int)local_4f0 - 2U < 9) {
    pHVar25 = (HasherCommon *)
              ((long)&switchD_0010477e::switchdataD_00140db0 +
              (long)(int)(&switchD_0010477e::switchdataD_00140db0)[(int)local_4f0 - 2U]);
    local_4f0._4_4_ = (int)((ulong)local_6c0 >> 0x20);
    bVar21 = (byte)((ulong)local_6c0 >> 0x20);
    switch((int)local_4f0) {
    default:
switchD_0010477e_caseD_2:
      pHVar25 = (HasherCommon *)&available_in;
      local_4d8._0_8_ = pHVar25;
      local_4d8._8_8_ = pHVar13;
      break;
    case 5:
      local_4b8 = (size_t)&available_in;
      local_4d8._0_8_ = 1L << (bVar21 & 0x3f);
      pHVar25 = (HasherCommon *)(ulong)uStack_6b8;
      local_4d8._8_8_ = 1L << ((byte)uStack_6b8 & 0x3f);
      iStack_4c4 = (int)local_4d8._8_8_ + -1;
      local_4d8._16_4_ = 0x20 - local_4f0._4_4_;
      local_4a8 = (long)&pHVar13->extra + local_4d8._0_8_ * 2;
      local_4c0 = CONCAT44(local_6b0,uStack_6b8);
      uVar6 = stack0xfffffffffffffb38;
      _local_4b0 = pHVar13;
      break;
    case 6:
      local_4a8 = &available_in;
      local_4d8._16_4_ = 0x40 - local_4f0._4_4_;
      uStack_4e8._4_1_ = (char)iStack_6b4;
      local_4c0 = 0xffffffffffffffff >> (uStack_4e8._4_1_ * -8 & 0x3fU);
      local_4d8._0_8_ = 1L << (bVar21 & 0x3f);
      local_4d8._8_8_ = 1L << ((byte)uStack_6b8 & 0x3f);
      local_4b8 = CONCAT44(uStack_6b8,(int)local_4d8._8_8_ + -1);
      pHVar25 = (HasherCommon *)(ulong)local_6b0;
      local_4b0 = local_6b0;
      uStack_498 = (long)&pHVar13->extra + local_4d8._0_8_ * 2;
      uVar6 = stack0xfffffffffffffb38;
      local_4a0 = pHVar13;
      break;
    case 7:
    case 8:
    case 9:
      break;
    case 10:
      local_4c0 = &pHVar13[0x2aaa].params.block_bits;
      uVar9 = -1 << ((byte)local_6e0 & 0x1f);
      local_4d8._16_4_ = uVar9 + 1;
      pHVar25 = (HasherCommon *)(ulong)(uint)local_4d8._16_4_;
      local_4d8._0_8_ = ZEXT48(~uVar9);
      local_4d8._8_8_ = pHVar13;
      uVar6 = stack0xfffffffffffffb38;
    }
  }
  else {
    pHVar24 = (HasherCommon *)(ulong)((int)local_4f0 - 0x23U);
    if ((int)local_4f0 - 0x23U < 8) {
      cVar20 = (char)(available_out >> 0x20);
      uVar2 = (undefined3)(available_out >> 0x28);
      pHVar25 = (HasherCommon *)
                ((long)&switchD_00104736::switchdataD_00140dd4 +
                (long)(int)(&switchD_00104736::switchdataD_00140dd4)[(long)pHVar24]);
      switch(pHVar24) {
      case (HasherCommon *)0x0:
switchD_00104736_caseD_0:
        pHVar25 = (HasherCommon *)&available_in;
        local_490.factor = local_4dc;
        local_490.chunk_len = local_6b0;
        uStack_498 = puStack_500;
        local_490._0_8_ = pBStack_4f8;
        local_490.table = local_6c0;
        uStack_460 = 1;
        local_458 = &available_out;
        local_4a0 = pHVar13;
        local_490.next_ix = sVar4;
        local_490._32_8_ = pHVar13;
        local_468 = pHVar25;
        break;
      case (HasherCommon *)0x5:
      case (HasherCommon *)0x6:
        local_4c0 = &available_in;
        bVar21 = cVar20 - 4;
        pHVar25 = (HasherCommon *)(ulong)CONCAT31(uVar2,bVar21);
        local_4d8._8_8_ =
             (HasherCommon *)(ulong)(((int)available_out._4_4_ < 7) + 7 << (bVar21 & 0x1f));
        uVar6 = pHVar13;
        break;
      case (HasherCommon *)0x7:
        local_c8 = &available_in;
        bVar21 = cVar20 - 4;
        pHVar25 = (HasherCommon *)(ulong)CONCAT31(uVar2,bVar21);
        local_d8 = ZEXT48(((int)available_out._4_4_ < 7) + 7 << (bVar21 & 0x1f));
        local_d0 = pHVar13;
      }
    }
    else {
      if ((int)local_4f0 == 0x36) goto switchD_0010477e_caseD_2;
      if ((int)local_4f0 == 0x37) goto switchD_00104736_caseD_0;
      pHVar25 = pHVar24;
      if ((int)local_4f0 == 0x41) {
        pHVar25 = (HasherCommon *)&available_in;
        uStack_440._4_4_ = local_4dc;
        uStack_440._0_4_ = local_6b0;
        _uStack_460 = puStack_500;
        local_458 = pBStack_4f8;
        uStack_450 = local_6c0;
        local_428 = 1;
        local_420 = &available_out;
        local_468 = pHVar13;
        local_448 = sVar4;
        local_438 = pHVar13;
        local_430 = pHVar25;
      }
    }
  }
  stack0xfffffffffffffb38 = uVar6;
  local_4dc = 0;
  iVar8 = (int)local_4f0;
  available_in = (size_t)pHVar13;
  local_4f0 = puVar5;
  uStack_4e8 = sVar4;
LAB_00104986:
  pHVar13 = local_7f0;
  pHVar24 = (HasherCommon *)&switchD_001049d9::switchdataD_00140df4;
  switch(iVar8) {
  case 2:
    pHVar24 = local_7f0;
    PrepareH2((H2 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
    break;
  case 3:
    pHVar24 = local_7f0;
    PrepareH3((H3 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
    break;
  case 4:
    pHVar24 = local_7f0;
    PrepareH4((H4 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
    break;
  case 5:
    pHVar24 = local_7f0;
    PrepareH5((H5 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
    break;
  case 6:
    pHVar24 = local_7f0;
    PrepareH6((H6 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
    break;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    for (lVar34 = 0; pHVar24 = (HasherCommon *)local_4d8._8_8_, lVar34 != 0x20000;
        lVar34 = lVar34 + 1) {
      *(undefined4 *)(local_4d8._8_8_ + lVar34 * 4) = local_4d8._16_4_;
    }
    break;
  default:
    pHVar24 = (HasherCommon *)&switchD_001049a9::switchdataD_00140e18;
    switch(iVar8) {
    case 0x23:
      pHVar24 = local_7f0;
      PrepareH35((H35 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
      break;
    case 0x28:
      pHVar24 = local_7f0;
      PrepareH40((H40 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
      break;
    case 0x29:
      pHVar24 = local_7f0;
      PrepareH41((H41 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
      break;
    case 0x2a:
      pHVar24 = local_7f0;
      PrepareH42((H42 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
      break;
    default:
      if (iVar8 == 0x36) {
        pHVar24 = local_7f0;
        PrepareH54((H54 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
      }
      else if (iVar8 == 0x37) {
        pHVar24 = local_7f0;
        PrepareH55((H55 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
      }
      else {
        pHVar24 = pHVar25;
        if (iVar8 == 0x41) {
          pHVar24 = local_7f0;
          PrepareH65((H65 *)local_4d8,1,sVar33,(uint8_t *)local_7f0);
        }
      }
    }
  }
  puStack_500 = (uint32_t *)0x0;
  pBStack_4f8 = (BrotliEncoderParams *)0x0;
  local_4dc = 1;
LAB_00104b23:
  if ((int)local_4f0 == 0x41) {
    psVar29 = &local_490.next_ix;
    PrepareHROLLING(&local_490,(int)sVar33,(size_t)pHVar13,(uint8_t *)pHVar24);
LAB_00104b71:
    *psVar29 = 0;
  }
  else {
    psVar29 = &local_4b8;
    if (((int)local_4f0 == 0x37) || ((int)local_4f0 == 0x23)) {
      PrepareHROLLING_FAST
                ((HROLLING_FAST *)(local_4d8 + 0x10),(int)sVar33,(size_t)pHVar13,(uint8_t *)pHVar24)
      ;
      goto LAB_00104b71;
    }
  }
  uVar14 = uVar11 >> 3;
  bVar43 = true;
  local_730 = 0;
  bVar21 = 0;
  local_7c8 = 0;
  local_778 = 0;
  local_728 = encoded_buffer;
  while ((uVar41 = local_7c8, bVar43 && (local_7c8 < local_800))) {
    uVar42 = local_7c8 + uVar11;
    if (local_800 < uVar42) {
      uVar42 = local_800;
    }
    last_insert_len = 0;
    uVar15 = (uVar42 - local_7c8) / 0xc + 0x10;
    num_literals = 0;
    literal_context_mode =
         ChooseContextMode((BrotliEncoderParams *)&available_out,(uint8_t *)pHVar13,local_7c8,
                           0x7fffffffffffffff,uVar42 - local_7c8);
    local_708 = 0;
    local_770 = 0;
    local_7b8 = 0;
    local_7d0 = (Command_conflict *)0x0;
    while( true ) {
      uVar26 = uVar42 - uVar41;
      uVar16 = local_7b8;
      if (uVar42 < uVar41 || uVar26 == 0) break;
      local_7a0 = uVar26;
      if (uVar12 <= uVar26) {
        local_7a0 = uVar12;
      }
      sVar33 = local_7a0 + 1;
      if (sVar33 == 0) {
        array = (ZopfliNode *)0x0;
      }
      else {
        array = (ZopfliNode *)BrotliAllocate(&memory_manager,sVar33 * 0x10);
      }
      BrotliInitZopfliNodes(array,sVar33);
      if ((0x7f < uVar41) && (2 < local_7a0)) {
        uVar16 = (local_7a0 + uVar41) - 0x7f;
        if (uVar41 < uVar16) {
          uVar16 = uVar41;
        }
        for (uVar26 = uVar41 - 0x7f; uVar26 < uVar16; uVar26 = uVar26 + 1) {
          uVar17 = uVar41 - uVar26;
          if (uVar41 - uVar26 < 0x10) {
            uVar17 = 0xf;
          }
          uVar23 = (uint)(*(int *)((long)&pHVar13->extra + (uVar26 & 0x7fffffffffffffff)) *
                         0x1e35a7bd) >> 0xf;
          uVar9 = *(uint *)(local_4d8._8_8_ + (ulong)uVar23 * 4);
          local_7b0 = (uVar26 & local_4d8._0_8_) * 2 + 1;
          local_7c0 = (uVar26 & local_4d8._0_8_) * 2;
          *(uint *)(local_4d8._8_8_ + (ulong)uVar23 * 4) = (uint)uVar26;
          lVar34 = 0x40;
          uVar31 = 0;
          pHVar25 = pHVar13;
          uVar38 = 0;
          while( true ) {
            uVar40 = uVar38;
            uVar36 = (ulong)uVar9;
            if (uVar26 == uVar36) break;
            bVar43 = lVar34 == 0;
            lVar34 = lVar34 + -1;
            if ((local_4d8._0_8_ - uVar17 < uVar26 - uVar36) || (bVar43)) break;
            uVar37 = uVar40;
            if (uVar31 < uVar40) {
              uVar37 = uVar31;
            }
            uVar30 = 0x80 - uVar37;
            uVar18 = uVar30 & 0xfffffffffffffff8;
            lVar39 = uVar37 + (uVar26 & 0x7fffffffffffffff);
            uVar38 = 0;
            lVar35 = 0;
LAB_00104e6d:
            if (uVar30 >> 3 == uVar38) {
              uVar27 = (ulong)((uint)uVar30 & 7);
              for (; (bVar43 = uVar27 != 0, uVar27 = uVar27 - 1, uVar38 = uVar30, bVar43 &&
                     (uVar38 = uVar18,
                     *(char *)((long)&pHVar13->extra + uVar18 + lVar39) ==
                     *(char *)((long)&pHVar25->extra + uVar18 + uVar37 + uVar36)));
                  uVar18 = uVar18 + 1) {
              }
            }
            else {
              uVar27 = *(ulong *)((long)&pHVar25->extra + uVar38 * 8 + uVar37 + uVar36);
              uVar28 = *(ulong *)((long)&pHVar13->extra + uVar38 * 8 + lVar39);
              if (uVar27 == uVar28) goto code_r0x00104e86;
              uVar28 = uVar28 ^ uVar27;
              uVar38 = 0;
              if (uVar28 != 0) {
                for (; (uVar28 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                }
              }
              uVar38 = (uVar38 >> 3 & 0x1fffffff) - lVar35;
            }
            uVar38 = uVar38 + uVar37;
            local_760 = (uint)local_4d8._0_8_;
            local_7e0 = uVar31;
            local_7a8 = uVar40;
            if (0x7f < uVar38) {
              *(int *)((long)&((HasherCommon *)local_4c0)->extra + local_7c0 * 4) =
                   *(int *)(&((HasherCommon *)local_4c0)->extra + (uVar9 & local_760));
              pHVar25 = local_7f0;
              uVar7 = *(uint32_t *)
                       ((long)&((HasherCommon *)local_4c0)->extra +
                       (ulong)(uVar9 & local_760) * 8 + 4);
              goto LAB_00104f6d;
            }
            uVar37 = (ulong)(uVar9 & local_760) * 2;
            if (*(byte *)((long)&pHVar25->extra + uVar38 + uVar36) <
                *(byte *)((long)&pHVar13->extra + uVar38 + (uVar26 & 0x7fffffffffffffff))) {
              *(uint *)((long)&((HasherCommon *)local_4c0)->extra + local_7c0 * 4) = uVar9;
              uVar37 = uVar37 | 1;
              uVar31 = uVar38;
              uVar38 = uVar40;
              local_7c0 = uVar37;
            }
            else {
              *(uint *)((long)&((HasherCommon *)local_4c0)->extra + local_7b0 * 4) = uVar9;
              local_7b0 = uVar37;
            }
            uVar9 = *(int *)((long)&((HasherCommon *)local_4c0)->extra + uVar37 * 4);
            pHVar25 = local_7f0;
          }
          *(undefined4 *)((long)&((HasherCommon *)local_4c0)->extra + local_7c0 * 4) =
               local_4d8._16_4_;
          uVar7 = local_4d8._16_4_;
LAB_00104f6d:
          *(uint32_t *)((long)&((HasherCommon *)local_4c0)->extra + local_7b0 * 4) = uVar7;
          pHVar13 = pHVar25;
        }
      }
      sVar33 = BrotliZopfliComputeShortestPath
                         (&memory_manager,local_7a0,uVar41,(uint8_t *)pHVar13,0x7fffffffffffffff,
                          "" + (literal_context_mode << 9),(BrotliEncoderParams *)&available_out,
                          dist_cache,(Hasher *)&available_in,array);
      uVar16 = local_7b8 + sVar33 + 1;
      if (uVar16 < uVar15) {
        uVar16 = uVar15;
      }
      pCVar19 = local_7d0;
      if ((local_770 != uVar16) &&
         (pCVar19 = (Command_conflict *)BrotliAllocate(&memory_manager,uVar16 << 4), p = local_7d0,
         pHVar13 = local_7f0, local_770 = uVar16, local_7d0 != (Command_conflict *)0x0)) {
        memcpy(pCVar19,local_7d0,local_7b8 << 4);
        BrotliFree(&memory_manager,p);
        pHVar13 = local_7f0;
      }
      uVar26 = local_7a0;
      uVar16 = sVar33 + local_7b8;
      local_7d0 = pCVar19;
      BrotliZopfliCreateCommands
                (local_7a0,uVar41,array,dist_cache,&last_insert_len,
                 (BrotliEncoderParams *)&available_out,pCVar19 + local_7b8,&num_literals);
      local_708 = local_708 + uVar26;
      BrotliFree(&memory_manager,array);
      if ((uVar14 < uVar16) || (uVar41 = uVar41 + uVar26, local_7b8 = uVar16, uVar14 < num_literals)
         ) break;
    }
    uVar41 = local_7c8;
    pHVar25 = local_7f0;
    if (last_insert_len != 0) {
      local_7d0[uVar16].insert_len_ = (uint32_t)last_insert_len;
      local_7d0[uVar16].copy_len_ = 0x8000000;
      local_7d0[uVar16].dist_extra_ = 0;
      local_7d0[uVar16].dist_prefix_ = 0x10;
      if (last_insert_len < 6) {
        uVar42 = last_insert_len & 0xffffffff;
      }
      else if (last_insert_len < 0x82) {
        uVar9 = 0x1f;
        uVar23 = (uint)(last_insert_len - 2);
        if (uVar23 != 0) {
          for (; uVar23 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar42 = (ulong)((int)(last_insert_len - 2 >> ((char)(uVar9 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar9 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (last_insert_len < 0x842) {
        uVar23 = (uint32_t)last_insert_len - 0x42;
        uVar9 = 0x1f;
        if (uVar23 != 0) {
          for (; uVar23 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar42 = (ulong)((uVar9 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar42 = 0x15;
        if (0x1841 < last_insert_len) {
          uVar42 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
        }
      }
      iVar8 = (int)((uVar42 & 0xffff) >> 3) * 3;
      local_7d0[uVar16].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar8 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar8 * 0x40 +
           ((ushort)uVar42 & 7) * 8 + 0x42;
      num_literals = num_literals + last_insert_len;
      uVar16 = uVar16 + 1;
    }
    local_7e0 = local_708 + local_7c8;
    local_7d8 = (ulong)last_bytes_bits;
    if (local_708 == 0) {
      storage = (uint16_t *)BrotliAllocate(&memory_manager,0x10);
      *storage = last_bytes;
      *(ulong *)((long)storage + (local_7d8 >> 3)) =
           3L << ((byte)local_7d8 & 7) | (ulong)*(byte *)((long)storage + (local_7d8 >> 3));
      local_7d8 = (ulong)((int)local_7d8 + 9U & 0xfffffff8);
    }
    else {
      local_7a8 = (ulong)(local_7e0 == local_800);
      iVar8 = ShouldCompress((uint8_t *)local_7f0,0x7fffffffffffffff,local_7c8,local_708,
                             num_literals,uVar16);
      if (iVar8 == 0) {
        dist_cache[0] = saved_dist_cache[0];
        dist_cache[1] = saved_dist_cache[1];
        dist_cache[2] = saved_dist_cache[2];
        dist_cache[3] = saved_dist_cache[3];
        storage = (uint16_t *)BrotliAllocate(&memory_manager,local_708 + 0x10);
        *storage = last_bytes;
        BrotliStoreUncompressedMetaBlock
                  ((int)local_7a8,(uint8_t *)pHVar25,uVar41,0x7fffffffffffffff,local_708,&local_7d8,
                   (uint8_t *)storage);
      }
      else {
        memcpy(&next_out,&available_out,0x90);
        BrotliInitBlockSplit((BlockSplit *)&next_in);
        BrotliInitBlockSplit(&local_5b8);
        BrotliInitBlockSplit(&local_588);
        pCVar19 = local_7d0;
        local_518 = (HistogramDistance *)0x0;
        sStack_510 = 0;
        local_528 = (HistogramCommand *)0x0;
        sStack_520 = 0;
        local_538 = (HistogramLiteral *)0x0;
        sStack_530 = 0;
        local_548 = (uint32_t *)0x0;
        sStack_540 = 0;
        local_558 = (uint32_t *)0x0;
        sStack_550 = 0;
        local_7b0 = local_730;
        local_7c0 = CONCAT44(local_7c0._4_4_,(uint)bVar21);
        local_7c8 = uVar41;
        BrotliBuildMetaBlock
                  (&memory_manager,(uint8_t *)pHVar25,uVar41,0x7fffffffffffffff,
                   (BrotliEncoderParams *)&next_out,bVar21,(uint8_t)local_730,local_7d0,uVar16,
                   literal_context_mode,literals_block_splits_decoder,&current_block_literals,
                   cmds_block_splits_decoder,&current_block_cmds,(MetaBlockSplit *)&next_in);
        BrotliOptimizeHistograms(local_74,(MetaBlockSplit *)&next_in);
        storage = (uint16_t *)BrotliAllocate(&memory_manager,local_708 * 2 + 0x1f7);
        uVar41 = local_7c8;
        *storage = last_bytes;
        BrotliStoreMetaBlock
                  (&memory_manager,(uint8_t *)pHVar25,local_7c8,local_708,0x7fffffffffffffff,
                   (uint8_t)local_7c0,(uint8_t)local_7b0,(int)local_7a8,
                   (BrotliEncoderParams *)&next_out,literal_context_mode,pCVar19,uVar16,
                   (MetaBlockSplit *)&next_in,&local_7d8,(uint8_t *)storage);
        if (local_708 + 4 < local_7d8 >> 3) {
          dist_cache[0] = saved_dist_cache[0];
          dist_cache[1] = saved_dist_cache[1];
          dist_cache[2] = saved_dist_cache[2];
          dist_cache[3] = saved_dist_cache[3];
          *storage = last_bytes;
          local_7d8 = (ulong)last_bytes_bits;
          BrotliStoreUncompressedMetaBlock
                    ((int)local_7a8,(uint8_t *)local_7f0,uVar41,0x7fffffffffffffff,local_708,
                     &local_7d8,(uint8_t *)storage);
        }
        BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&next_in);
        BrotliDestroyBlockSplit(&memory_manager,&local_5b8);
        BrotliDestroyBlockSplit(&memory_manager,&local_588);
        BrotliFree(&memory_manager,local_558);
        local_558 = (uint32_t *)0x0;
        BrotliFree(&memory_manager,local_548);
        local_548 = (uint32_t *)0x0;
        BrotliFree(&memory_manager,local_538);
        local_538 = (HistogramLiteral *)0x0;
        BrotliFree(&memory_manager,local_528);
        local_528 = (HistogramCommand *)0x0;
        BrotliFree(&memory_manager,local_518);
      }
    }
    uVar41 = local_7e0;
    uVar42 = local_7d8 >> 3;
    last_bytes = (uint16_t)*(byte *)((long)storage + uVar42);
    last_bytes_bits = (byte)local_7d8 & 7;
    if (local_7e0 < local_800) {
      local_730 = (ulong)*(byte *)((long)local_7f0 + (local_7e0 - 2));
      bVar21 = *(byte *)((long)local_7f0 + (local_7e0 - 1));
    }
    saved_dist_cache[0] = dist_cache[0];
    saved_dist_cache[1] = dist_cache[1];
    saved_dist_cache[2] = dist_cache[2];
    saved_dist_cache[3] = dist_cache[3];
    local_778 = local_778 + uVar42;
    bVar43 = local_778 <= uVar1;
    if (bVar43) {
      memcpy(local_728,storage,uVar42);
      local_728 = local_728 + uVar42;
    }
    BrotliFree(&memory_manager,storage);
    BrotliFree(&memory_manager,local_7d0);
    pHVar13 = local_7f0;
    local_7c8 = uVar41;
  }
  *local_7e8 = local_778;
  if (available_in != 0) {
    BrotliFree(&memory_manager,(void *)available_in);
  }
  if ((!bVar43) || ((iVar8 = 1, sVar10 != 0 && (sVar10 < *local_7e8)))) {
LAB_00105684:
    *local_7e8 = 0;
    iVar8 = 0;
    if (sVar10 - 1 < uVar1) {
      lVar34 = 2;
      encoded_buffer[0] = '!';
      encoded_buffer[1] = '\x03';
      iVar8 = 1;
      lVar39 = 0;
      for (sVar10 = local_800; sVar10 != 0; sVar10 = sVar10 - __n) {
        __n = 0x1000000;
        if (sVar10 < 0x1000000) {
          __n = sVar10;
        }
        iVar3 = 2 - (uint)(sVar10 < 0x100001);
        if (sVar10 < 0x10001) {
          iVar3 = 0;
        }
        uVar23 = ((int)__n * 8 + iVar3 * 2) - 8;
        uVar9 = 0x80000 << ((byte)(iVar3 << 2) & 0x1f) | uVar23;
        encoded_buffer[lVar34] = (uint8_t)uVar23;
        encoded_buffer[lVar34 + 1] = (uint8_t)((uint)((int)__n * 8 + -8) >> 8);
        encoded_buffer[lVar34 + 2] = (uint8_t)(uVar9 >> 0x10);
        if (sVar10 < 0x100001) {
          lVar34 = lVar34 + 3;
        }
        else {
          encoded_buffer[lVar34 + 3] = (uint8_t)(uVar9 >> 0x18);
          lVar34 = lVar34 + 4;
        }
        memcpy(encoded_buffer + lVar34,(void *)((long)&local_7f0->extra + lVar39),__n);
        lVar34 = lVar34 + __n;
        lVar39 = lVar39 + __n;
      }
      encoded_buffer[lVar34] = '\x03';
      *local_7e8 = lVar34 + 1;
    }
  }
  return iVar8;
code_r0x00104e86:
  lVar35 = lVar35 + -8;
  uVar38 = uVar38 + 1;
  goto LAB_00104e6d;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer,
    const BackwardReferenceFromDecoder* backward_references,
    const size_t back_refs_size,
    const BlockSplitFromDecoder* literals_block_splits_decoder,
    const BlockSplitFromDecoder* cmds_block_splits_decoder) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_LARGE_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer,
                                           backward_references, back_refs_size,
                                           literals_block_splits_decoder,
                                           cmds_block_splits_decoder);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  s->backward_references_ = backward_references;
  s->back_refs_size_ = back_refs_size;
  s->literals_block_splits_decoder_ = literals_block_splits_decoder;
  s->cmds_block_splits_decoder_ = cmds_block_splits_decoder;
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}